

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O1

void recff_pcall(jit_State *J,RecordFFData *rd)

{
  if ((ulong)J->maxslot != 0) {
    memmove(J->base + 1,J->base,(ulong)J->maxslot << 2);
    lj_record_call(J,0,(ulong)(J->maxslot - 1));
    rd->nres = -1;
    J->needsnap = '\x01';
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_pcall(jit_State *J, RecordFFData *rd)
{
  if (J->maxslot >= 1) {
#if LJ_FR2
    /* Shift function arguments up. */
    memmove(J->base + 1, J->base, sizeof(TRef) * J->maxslot);
#endif
    lj_record_call(J, 0, J->maxslot - 1);
    rd->nres = -1;  /* Pending call. */
    J->needsnap = 1;  /* Start catching on-trace errors. */
  }  /* else: Interpreter will throw. */
}